

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipe.hpp
# Opt level: O1

MapStream<lambda::streams::Range<std::vector<int,_std::allocator<int>_>_>,_lambda::Curried<std::plus<void>,_int>_>
* __thiscall
lambda::streams::Pipeable::
pipeable<lambda::streams::Range<std::vector<int,std::allocator<int>>>,lambda::streams::Map<lambda::Curried<std::plus<void>,int>>>
          (MapStream<lambda::streams::Range<std::vector<int,_std::allocator<int>_>_>,_lambda::Curried<std::plus<void>,_int>_>
           *__return_storage_ptr__,Pipeable *this,
          Range<std::vector<int,_std::allocator<int>_>_> *arg,
          Map<lambda::Curried<std::plus<void>,_int>_> *pipeable)

{
  Curried<std::plus<void>,_int> CVar1;
  vector<int,_std::allocator<int>_> local_68;
  int *local_50;
  int *piStack_48;
  vector<int,_std::allocator<int>_> local_38;
  int *local_20;
  int *piStack_18;
  
  local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       *(pointer *)this;
  local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       *(pointer *)(this + 8);
  local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = *(pointer *)(this + 0x10);
  *(undefined8 *)this = 0;
  *(undefined8 *)(this + 8) = 0;
  *(undefined8 *)(this + 0x10) = 0;
  local_20 = *(int **)(this + 0x18);
  piStack_18 = *(int **)(this + 0x20);
  std::vector<int,_std::allocator<int>_>::vector(&local_68,&local_38);
  local_50 = local_20;
  piStack_48 = piStack_18;
  CVar1 = (Curried<std::plus<void>,_int>)
          (arg->range).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
          ._M_start;
  (__return_storage_ptr__->stream).range.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_start;
  (__return_storage_ptr__->stream).range.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  (__return_storage_ptr__->stream).range.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->stream).begin_._M_current = local_20;
  (__return_storage_ptr__->stream).end_._M_current = piStack_18;
  __return_storage_ptr__->fn = CVar1;
  if (local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

static auto pipeable(Arg &&arg, Pipeable pipeable) {
        return pipeable.pipe(std::forward<Arg>(arg));
    }